

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesOptionsWidget.cxx
# Opt level: O2

void __thiscall cmCursesOptionsWidget::NextOption(cmCursesOptionsWidget *this)

{
  pointer pbVar1;
  ulong uVar2;
  
  uVar2 = this->CurrentOption + 1;
  this->CurrentOption = uVar2;
  pbVar1 = (this->Options).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (((long)(this->Options).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U < uVar2) {
    this->CurrentOption = 0;
    uVar2 = 0;
  }
  (*(this->super_cmCursesWidget)._vptr_cmCursesWidget[4])(this,pbVar1 + uVar2);
  return;
}

Assistant:

void cmCursesOptionsWidget::NextOption()
{
  this->CurrentOption++;
  if(this->CurrentOption > this->Options.size()-1)
    {
    this->CurrentOption = 0;
    }
  this->SetValue(this->Options[this->CurrentOption]);
}